

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O0

int KINSetConstraints(void *kinmem,N_Vector constraints)

{
  N_Vector p_Var1;
  long in_RSI;
  KINMem in_RDI;
  double dVar2;
  sunrealtype temptest;
  KINMem kin_mem;
  int local_4;
  
  if (in_RDI == (KINMem)0x0) {
    KINProcessError((KINMem)0x0,-1,0x32f,"KINSetConstraints",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                    ,"kinsol_mem = NULL illegal.");
    local_4 = -1;
  }
  else if (in_RSI == 0) {
    if (in_RDI->kin_constraintsSet != 0) {
      N_VDestroy(in_RDI->kin_constraints);
      in_RDI->kin_lrw = in_RDI->kin_lrw - in_RDI->kin_lrw1;
      in_RDI->kin_liw = in_RDI->kin_liw - in_RDI->kin_liw1;
    }
    in_RDI->kin_constraintsSet = 0;
    local_4 = 0;
  }
  else {
    dVar2 = (double)N_VMaxNorm(in_RSI);
    if (dVar2 <= 2.5) {
      if (in_RDI->kin_constraintsSet == 0) {
        p_Var1 = (N_Vector)N_VClone(in_RSI);
        in_RDI->kin_constraints = p_Var1;
        in_RDI->kin_lrw = in_RDI->kin_lrw1 + in_RDI->kin_lrw;
        in_RDI->kin_liw = in_RDI->kin_liw1 + in_RDI->kin_liw;
        in_RDI->kin_constraintsSet = 1;
      }
      N_VScale(0x3ff0000000000000,in_RSI,in_RDI->kin_constraints);
      local_4 = 0;
    }
    else {
      KINProcessError(in_RDI,-2,0x346,"KINSetConstraints",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                      ,"Illegal values in constraints vector.");
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

int KINSetConstraints(void* kinmem, N_Vector constraints)
{
  KINMem kin_mem;
  sunrealtype temptest;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (constraints == NULL)
  {
    if (kin_mem->kin_constraintsSet)
    {
      N_VDestroy(kin_mem->kin_constraints);
      kin_mem->kin_lrw -= kin_mem->kin_lrw1;
      kin_mem->kin_liw -= kin_mem->kin_liw1;
    }
    kin_mem->kin_constraintsSet = SUNFALSE;
    return (KIN_SUCCESS);
  }

  /* Check the constraints vector */

  temptest = N_VMaxNorm(constraints);
  if (temptest > TWOPT5)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_CONSTRAINTS);
    return (KIN_ILL_INPUT);
  }

  if (!kin_mem->kin_constraintsSet)
  {
    kin_mem->kin_constraints = N_VClone(constraints);
    kin_mem->kin_lrw += kin_mem->kin_lrw1;
    kin_mem->kin_liw += kin_mem->kin_liw1;
    kin_mem->kin_constraintsSet = SUNTRUE;
  }

  /* Load the constraint vector */

  N_VScale(ONE, constraints, kin_mem->kin_constraints);

  return (KIN_SUCCESS);
}